

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMask::ChLinkMask(ChLinkMask *this,ChLinkMask *other)

{
  int iVar1;
  ChConstraintTwoBodies *pCVar2;
  long lVar3;
  
  this->_vptr_ChLinkMask = (_func_int **)&PTR__ChLinkMask_00b15ac0;
  (this->constraints).
  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constraints).
  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constraints).
  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = other->nconstr;
  this->nconstr = iVar1;
  std::vector<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>::
  resize(&this->constraints,(long)iVar1);
  if (0 < this->nconstr) {
    lVar3 = 0;
    do {
      pCVar2 = (ChConstraintTwoBodies *)
               (**(code **)((long)((other->constraints).
                                   super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar3]->
                                  super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint +
                           0x10))();
      (this->constraints).
      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar3] = pCVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->nconstr);
  }
  return;
}

Assistant:

ChLinkMask::ChLinkMask(const ChLinkMask& other) {
    nconstr = other.nconstr;
    constraints.resize(other.nconstr);
    for (int i = 0; i < nconstr; i++) {
        constraints[i] = other.constraints[i]->Clone();
    }
}